

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p256_64.h
# Opt level: O0

void fiat_p256_subborrowx_u64
               (uint64_t *out1,fiat_p256_uint1 *out2,fiat_p256_uint1 arg1,uint64_t arg2,
               uint64_t arg3)

{
  ulong uVar1;
  uint64_t x3;
  fiat_p256_int1 x2;
  fiat_p256_int128 x1;
  uint64_t arg3_local;
  uint64_t arg2_local;
  fiat_p256_uint1 arg1_local;
  fiat_p256_uint1 *out2_local;
  uint64_t *out1_local;
  
  uVar1 = arg2 - arg1;
  *out1 = uVar1 - arg3;
  *out2 = -(-(uVar1 < arg3) - (arg2 < arg1));
  return;
}

Assistant:

static FIAT_P256_FIAT_INLINE void fiat_p256_subborrowx_u64(uint64_t* out1, fiat_p256_uint1* out2, fiat_p256_uint1 arg1, uint64_t arg2, uint64_t arg3) {
  fiat_p256_int128 x1;
  fiat_p256_int1 x2;
  uint64_t x3;
  x1 = ((arg2 - (fiat_p256_int128)arg1) - arg3);
  x2 = (fiat_p256_int1)(x1 >> 64);
  x3 = (uint64_t)(x1 & UINT64_C(0xffffffffffffffff));
  *out1 = x3;
  *out2 = (fiat_p256_uint1)(0x0 - x2);
}